

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void hermite_gk18_set(int n,double *x,double *w)

{
  if (n < 9) {
    if (n == 1) {
      *x = 0.0;
      *w = 1.7724538509055159;
    }
    else {
      if (n != 3) {
LAB_001de6e9:
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"HERMITE_GK18_SET - Fatal error!\n");
        std::operator<<((ostream *)&std::cerr,"  Illegal input value of N.\n");
        std::operator<<((ostream *)&std::cerr,"  N must be 1, 3, 9, 19, or 37.\n");
        exit(1);
      }
      *x = -1.224744871391589;
      x[1] = 0.0;
      x[2] = 1.224744871391589;
      *w = 0.2954089751509193;
      w[1] = 1.1816359006036772;
      w[2] = 0.2954089751509193;
    }
  }
  else if (n == 9) {
    *x = -2.959210779063838;
    x[1] = -2.0232301911005157;
    x[2] = -1.224744871391589;
    x[3] = -0.5240335474869576;
    x[4] = 0.0;
    x[5] = 0.5240335474869576;
    x[6] = 1.224744871391589;
    x[7] = 2.0232301911005157;
    x[8] = 2.959210779063838;
    *w = 0.00016708826306882348;
    w[1] = 0.014173117873979098;
    w[2] = 0.16811892894767771;
    w[3] = 0.47869428549114124;
    w[4] = 0.45014700975378197;
    w[5] = 0.47869428549114124;
    w[6] = 0.16811892894767771;
    w[7] = 0.014173117873979098;
    w[8] = 0.00016708826306882348;
  }
  else if (n == 0x13) {
    *x = -4.499599398310388;
    x[1] = -3.667774215946338;
    x[2] = -2.959210779063838;
    x[3] = -2.2665132620567876;
    x[4] = -2.0232301911005157;
    x[5] = -1.8357079751751868;
    x[6] = -1.224744871391589;
    x[7] = -0.8700408953529029;
    x[8] = -0.5240335474869576;
    x[9] = 0.0;
    x[10] = 0.5240335474869576;
    x[0xb] = 0.8700408953529029;
    x[0xc] = 1.224744871391589;
    x[0xd] = 1.8357079751751868;
    x[0xe] = 2.0232301911005157;
    x[0xf] = 2.2665132620567876;
    x[0x10] = 2.959210779063838;
    x[0x11] = 3.667774215946338;
    x[0x12] = 4.499599398310388;
    *w = 1.5295717705322357e-09;
    w[1] = 1.0802767206624762e-06;
    w[2] = 0.00010656589772852267;
    w[3] = 0.0051133174390883855;
    w[4] = -0.011232438489069229;
    w[5] = 0.03205524309944588;
    w[6] = 0.11360729895748269;
    w[7] = 0.10838861955003017;
    w[8] = 0.3692464336892085;
    w[9] = 0.5378816070051017;
    w[10] = 0.3692464336892085;
    w[0xb] = 0.10838861955003017;
    w[0xc] = 0.11360729895748269;
    w[0xd] = 0.03205524309944588;
    w[0xe] = -0.011232438489069229;
    w[0xf] = 0.0051133174390883855;
    w[0x10] = 0.00010656589772852267;
    w[0x11] = 1.0802767206624762e-06;
    w[0x12] = 1.5295717705322357e-09;
  }
  else {
    if (n != 0x25) goto LAB_001de6e9;
    *x = -6.853200069757519;
    x[1] = -6.124527854622158;
    x[2] = -5.52186520986835;
    x[3] = -4.986551454150765;
    x[4] = -4.499599398310388;
    x[5] = -4.057956316089741;
    x[6] = -3.667774215946338;
    x[7] = -3.31558461759329;
    x[8] = -2.959210779063838;
    x[9] = -2.597288631188366;
    x[10] = -2.266513262056788;
    x[0xb] = -2.023230191100516;
    x[0xc] = -1.835707975175187;
    x[0xd] = -1.561553427651873;
    x[0xe] = -1.224744871391589;
    x[0xf] = -0.870040895352903;
    x[0x10] = -0.524033547486958;
    x[0x11] = -0.214618180588171;
    x[0x12] = 0.0;
    x[0x13] = 0.214618180588171;
    x[0x14] = 0.524033547486958;
    x[0x15] = 0.870040895352903;
    x[0x16] = 1.224744871391589;
    x[0x17] = 1.561553427651873;
    x[0x18] = 1.835707975175187;
    x[0x19] = 2.023230191100516;
    x[0x1a] = 2.266513262056788;
    x[0x1b] = 2.597288631188366;
    x[0x1c] = 2.959210779063838;
    x[0x1d] = 3.31558461759329;
    x[0x1e] = 3.667774215946338;
    x[0x1f] = 4.057956316089741;
    x[0x20] = 4.499599398310388;
    x[0x21] = 4.986551454150765;
    x[0x22] = 5.52186520986835;
    x[0x23] = 6.124527854622158;
    x[0x24] = 6.853200069757519;
    *w = 1.9030350940130497e-21;
    w[1] = 1.8778189314372896e-17;
    w[2] = 1.8224275154912936e-14;
    w[3] = 4.566176367618686e-12;
    w[4] = 4.2252584396311105e-10;
    w[5] = 1.6595448809389818e-08;
    w[6] = 2.9590752023074407e-07;
    w[7] = 3.3097587097920343e-06;
    w[8] = 3.2265185983739745e-05;
    w[9] = 0.0002349403664659752;
    w[10] = 0.0009858275829964839;
    w[0xb] = 0.0017680222581829544;
    w[0xc] = 0.004333498812272349;
    w[0xd] = 0.015513109874859354;
    w[0xe] = 0.04421164421898455;
    w[0xf] = 0.09372082806552459;
    w[0x10] = 0.1430993028968334;
    w[0x11] = 0.14765571040268624;
    w[0x12] = 0.09688245529284255;
    w[0x13] = 0.14765571040268624;
    w[0x14] = 0.1430993028968334;
    w[0x15] = 0.09372082806552459;
    w[0x16] = 0.04421164421898455;
    w[0x17] = 0.015513109874859354;
    w[0x18] = 0.004333498812272349;
    w[0x19] = 0.0017680222581829544;
    w[0x1a] = 0.0009858275829964839;
    w[0x1b] = 0.0002349403664659752;
    w[0x1c] = 3.2265185983739745e-05;
    w[0x1d] = 3.3097587097920343e-06;
    w[0x1e] = 2.9590752023074407e-07;
    w[0x1f] = 1.6595448809389818e-08;
    w[0x20] = 4.2252584396311105e-10;
    w[0x21] = 4.566176367618686e-12;
    w[0x22] = 1.8224275154912936e-14;
    w[0x23] = 1.8778189314372896e-17;
    w[0x24] = 1.9030350940130497e-21;
  }
  return;
}

Assistant:

void hermite_gk18_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_GK18_SET sets a Hermite Genz-Keister 18 rule.
//
//  Discussion:
//
//    The integral:
//
//      integral ( -oo <= x <= +oo ) f(x) exp ( - x * x ) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//    A nested family of rules for the Hermite integration problem
//    was produced by Genz and Keister.  The structure of the nested
//    family was denoted by 1+2+6+10+18, that is, it comprised rules 
//    of successive orders O = 1, 3, 9, 19, and 37.
//
//    The precisions of these rules are P = 1, 5, 15, 29, and 55.
//
//    Some of the data in this function was kindly supplied directly by
//    Alan Genz on 24 April 2011.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    30 April 2011
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Alan Genz, Bradley Keister,
//    Fully symmetric interpolatory rules for multiple integrals
//    over infinite regions with Gaussian weight,
//    Journal of Computational and Applied Mathematics,
//    Volume 71, 1996, pages 299-309
//
//    Florian Heiss, Viktor Winschel,
//    Likelihood approximation by numerical integration on sparse grids,
//    Journal of Econometrics,
//    Volume 144, 2008, pages 62-80.
//
//    Thomas Patterson,
//    The Optimal Addition of Points to Quadrature Formulae,
//    Mathematics of Computation,
//    Volume 22, Number 104, October 1968, pages 847-856.
//
//  Parameters:
//
//    Input, int N, the order.
//    N must be 1, 3, 9, 19, or 37.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  if ( n == 1 )
  {
    x[ 0] =   0.0000000000000000E+00;

    w[ 0] =   1.7724538509055159E+00;
  }
  else if ( n == 3 )
  {
    x[ 0] =  -1.2247448713915889E+00;
    x[ 1] =   0.0000000000000000E+00;
    x[ 2] =   1.2247448713915889E+00;

    w[ 0] =   2.9540897515091930E-01;
    w[ 1] =   1.1816359006036772E+00;
    w[ 2] =   2.9540897515091930E-01;
  }
  else if ( n == 9 )
  {
    x[ 0] =  -2.9592107790638380E+00;
    x[ 1] =  -2.0232301911005157E+00;
    x[ 2] =  -1.2247448713915889E+00;
    x[ 3] =  -5.2403354748695763E-01;
    x[ 4] =   0.0000000000000000E+00;
    x[ 5] =   5.2403354748695763E-01;
    x[ 6] =   1.2247448713915889E+00;
    x[ 7] =   2.0232301911005157E+00;
    x[ 8] =   2.9592107790638380E+00;

    w[ 0] =   1.6708826306882348E-04;
    w[ 1] =   1.4173117873979098E-02;
    w[ 2] =   1.6811892894767771E-01;
    w[ 3] =   4.7869428549114124E-01;
    w[ 4] =   4.5014700975378197E-01;
    w[ 5] =   4.7869428549114124E-01;
    w[ 6] =   1.6811892894767771E-01;
    w[ 7] =   1.4173117873979098E-02;
    w[ 8] =   1.6708826306882348E-04;
  }
  else if ( n == 19 )
  {
    x[ 0] =  -4.4995993983103881E+00;
    x[ 1] =  -3.6677742159463378E+00;
    x[ 2] =  -2.9592107790638380E+00;
    x[ 3] =  -2.2665132620567876E+00;
    x[ 4] =  -2.0232301911005157E+00;
    x[ 5] =  -1.8357079751751868E+00;
    x[ 6] =  -1.2247448713915889E+00;
    x[ 7] =  -8.7004089535290285E-01;
    x[ 8] =  -5.2403354748695763E-01;
    x[ 9] =   0.0000000000000000E+00;
    x[10] =   5.2403354748695763E-01;
    x[11] =   8.7004089535290285E-01;
    x[12] =   1.2247448713915889E+00;
    x[13] =   1.8357079751751868E+00;
    x[14] =   2.0232301911005157E+00;
    x[15] =   2.2665132620567876E+00;
    x[16] =   2.9592107790638380E+00;
    x[17] =   3.6677742159463378E+00;
    x[18] =   4.4995993983103881E+00;

    w[ 0] =   1.5295717705322357E-09;
    w[ 1] =   1.0802767206624762E-06;
    w[ 2] =   1.0656589772852267E-04;
    w[ 3] =   5.1133174390883855E-03;
    w[ 4] =  -1.1232438489069229E-02;
    w[ 5] =   3.2055243099445879E-02;
    w[ 6] =   1.1360729895748269E-01;
    w[ 7] =   1.0838861955003017E-01;
    w[ 8] =   3.6924643368920851E-01;
    w[ 9] =   5.3788160700510168E-01;
    w[10] =   3.6924643368920851E-01;
    w[11] =   1.0838861955003017E-01;
    w[12] =   1.1360729895748269E-01;
    w[13] =   3.2055243099445879E-02;
    w[14] =  -1.1232438489069229E-02;
    w[15] =   5.1133174390883855E-03;
    w[16] =   1.0656589772852267E-04;
    w[17] =   1.0802767206624762E-06;
    w[18] =   1.5295717705322357E-09;
  }
  else if ( n == 37 )
  {
    x[ 0] =  -6.853200069757519;
    x[ 1] =  -6.124527854622158;
    x[ 2] =  -5.521865209868350;
    x[ 3] =  -4.986551454150765;
    x[ 4] =  -4.499599398310388;
    x[ 5] =  -4.057956316089741;
    x[ 6] =  -3.667774215946338;
    x[ 7] =  -3.315584617593290;
    x[ 8] =  -2.959210779063838;
    x[ 9] =  -2.597288631188366;
    x[10] =  -2.266513262056788;
    x[11] =  -2.023230191100516;
    x[12] =  -1.835707975175187;
    x[13] =  -1.561553427651873;
    x[14] =  -1.224744871391589;
    x[15] =  -0.870040895352903;
    x[16] =  -0.524033547486958;
    x[17] =  -0.214618180588171;
    x[18] =   0.000000000000000;
    x[19] =   0.214618180588171;
    x[20] =   0.524033547486958;
    x[21] =   0.870040895352903;
    x[22] =   1.224744871391589;
    x[23] =   1.561553427651873;
    x[24] =   1.835707975175187;
    x[25] =   2.023230191100516;
    x[26] =   2.266513262056788;
    x[27] =   2.597288631188366;
    x[28] =   2.959210779063838;
    x[29] =   3.315584617593290;
    x[30] =   3.667774215946338;
    x[31] =   4.057956316089741;
    x[32] =   4.499599398310388;
    x[33] =   4.986551454150765;
    x[34] =   5.521865209868350;
    x[35] =   6.124527854622158;
    x[36] =   6.853200069757519;

    w[ 0] = 0.19030350940130498E-20;
    w[ 1] = 0.187781893143728947E-16;
    w[ 2] = 0.182242751549129356E-13;
    w[ 3] = 0.45661763676186859E-11;
    w[ 4] = 0.422525843963111041E-09;
    w[ 5] = 0.16595448809389819E-07;
    w[ 6] = 0.295907520230744049E-06;
    w[ 7] = 0.330975870979203419E-05;
    w[ 8] = 0.32265185983739747E-04;
    w[ 9] = 0.234940366465975222E-03;
    w[10] = 0.985827582996483824E-03;
    w[11] = 0.176802225818295443E-02;
    w[12] = 0.43334988122723492E-02;
    w[13] = 0.15513109874859354E-01;
    w[14] = 0.442116442189845444E-01;
    w[15] = 0.937208280655245902E-01;
    w[16] = 0.143099302896833389E+00;
    w[17] = 0.147655710402686249E+00;
    w[18] = 0.968824552928425499E-01;
    w[19] = 0.147655710402686249E+00;
    w[20] = 0.143099302896833389E+00;
    w[21] = 0.937208280655245902E-01;
    w[22] = 0.442116442189845444E-01;
    w[23] = 0.15513109874859354E-01;
    w[24] = 0.43334988122723492E-02;
    w[25] = 0.176802225818295443E-02;
    w[26] = 0.985827582996483824E-03;
    w[27] = 0.234940366465975222E-03;
    w[28] = 0.32265185983739747E-04;
    w[29] = 0.330975870979203419E-05;
    w[30] = 0.295907520230744049E-06;
    w[31] = 0.16595448809389819E-07;
    w[32] = 0.422525843963111041E-09;
    w[33] = 0.45661763676186859E-11;
    w[34] = 0.182242751549129356E-13;
    w[35] = 0.187781893143728947E-16;
    w[36] = 0.19030350940130498E-20;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "HERMITE_GK18_SET - Fatal error!\n";
    std::cerr << "  Illegal input value of N.\n";
    std::cerr << "  N must be 1, 3, 9, 19, or 37.\n";
    exit ( 1 );
  }
  return;
}